

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O3

void __thiscall
cmCTestMultiProcessHandler::CreateParallelTestCostList(cmCTestMultiProcessHandler *this)

{
  TestMap *this_00;
  _Rb_tree_node_base *__k;
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Rb_tree_color _Var3;
  pointer pbVar4;
  pointer pbVar5;
  iterator iVar6;
  vector<int,std::allocator<int>> *this_01;
  _Base_ptr p_Var7;
  mapped_type *ppcVar8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var9;
  _Base_ptr p_Var10;
  mapped_type *pmVar11;
  long lVar12;
  int *__buffer;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var13;
  _Base_ptr p_Var14;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *this_02;
  _Base_ptr p_Var15;
  _Base_ptr p_Var16;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var17;
  _Base_ptr *pp_Var18;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar19;
  pair<int_*,_long> pVar20;
  TestList sortedCopy;
  list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
  priorityStack;
  TestSet alreadySortedTests;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_d8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Stack_d0;
  _Base_ptr local_c8;
  _Base_ptr local_c0;
  _Base_ptr local_b8;
  size_t local_b0;
  vector<int,std::allocator<int>> *local_a8;
  _Rb_tree_node_base *local_a0;
  _Rb_tree_node_base local_98;
  cmCTestMultiProcessHandler *local_78;
  _Iter_comp_iter<TestComparator> local_70;
  _Iter_comp_iter<TestComparator> local_68;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._0_8_ = &local_98;
  local_98._M_left = (_Base_ptr)0x0;
  local_c0 = (_Base_ptr)&_Stack_d0;
  local_c8 = (_Base_ptr)0x0;
  local_d8._M_current = (int *)0x0;
  _Stack_d0._M_current = (int *)0x0;
  local_b0 = 0;
  local_b8 = local_c0;
  local_98._M_parent = (_Base_ptr)local_98._0_8_;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::
  list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>::
  _M_insert<cmCTestMultiProcessHandler::TestSet>
            ((list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
              *)local_98._0_8_,(iterator)local_98._0_8_,(TestSet *)&local_d8);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &local_d8);
  p_Var10 = (this->Tests).
            super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
            ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_a0 = &(this->Tests).
              super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
              ._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var10 != local_a0) {
    pp_Var18 = &(local_98._M_parent)->_M_left;
    local_a8 = (vector<int,std::allocator<int>> *)&this->Properties;
    local_98._M_right = (_Base_ptr)&this->SortedTests;
    do {
      pbVar4 = (this->LastTestsFailed).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar5 = (this->LastTestsFailed).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      __k = p_Var10 + 1;
      ppcVar8 = std::
                map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ::operator[]((map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                              *)local_a8,(key_type *)__k);
      _Var9 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        (pbVar4,pbVar5,*ppcVar8);
      this_02 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)pp_Var18
      ;
      if (_Var9._M_current !=
          (this->LastTestsFailed).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        iVar6._M_current =
             (this->SortedTests).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
        ;
        if (iVar6._M_current ==
            (this->SortedTests).super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)local_98._M_right,iVar6,(int *)__k);
          this_02 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                    &local_60;
        }
        else {
          *iVar6._M_current = __k->_M_color;
          (this->SortedTests).super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
               iVar6._M_current + 1;
          this_02 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                    &local_60;
        }
      }
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>(this_02,(int *)__k);
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
    } while (p_Var10 != local_a0);
  }
  if (local_98._M_parent[1]._M_right != (_Base_ptr)0x0) {
    this_00 = &this->Tests;
    local_78 = this;
    do {
      p_Var7 = local_98._M_parent;
      local_d8._M_current = (int *)0x0;
      _Stack_d0._M_current = (int *)0x0;
      local_c8 = (_Base_ptr)0x0;
      local_c0 = (_Base_ptr)&_Stack_d0;
      local_b0 = 0;
      local_b8 = local_c0;
      std::__cxx11::
      list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
      ::_M_insert<cmCTestMultiProcessHandler::TestSet>
                ((list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
                  *)&local_98,(iterator)&local_98,(TestSet *)&local_d8);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 &local_d8);
      p_Var16 = local_98._M_parent;
      p_Var10 = p_Var7[1]._M_parent;
      if (p_Var10 != (_Base_ptr)&p_Var7->_M_right) {
        pp_Var18 = &(local_98._M_parent)->_M_left;
        do {
          pmVar11 = std::
                    map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                    ::operator[](&this_00->
                                  super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                                 ,(key_type *)(p_Var10 + 1));
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_range_unique<std::_Rb_tree_const_iterator<int>>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     pp_Var18,(pmVar11->super_set<int,_std::less<int>,_std::allocator<int>_>)._M_t.
                              _M_impl.super__Rb_tree_header._M_header._M_left,
                     (_Rb_tree_const_iterator<int>)
                     &(pmVar11->super_set<int,_std::less<int>,_std::allocator<int>_>)._M_t._M_impl.
                      super__Rb_tree_header);
          p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
        } while (p_Var10 != (_Base_ptr)&p_Var7->_M_right);
      }
      this = local_78;
      p_Var10 = p_Var16[1]._M_parent;
      pp_Var18 = &p_Var16->_M_right;
      if (p_Var10 != (_Base_ptr)pp_Var18) {
        do {
          pVar19 = std::
                   _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                   equal_range((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                                *)&p_Var7->_M_left,(key_type *)(p_Var10 + 1));
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          _M_erase_aux((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                        *)&p_Var7->_M_left,(_Base_ptr)pVar19.first._M_node,
                       (_Base_ptr)pVar19.second._M_node);
          p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
        } while (p_Var10 != (_Base_ptr)pp_Var18);
      }
    } while (local_98._M_parent[1]._M_right != (_Base_ptr)0x0);
  }
  p_Var10 = &local_98;
  std::__cxx11::
  list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>::
  _M_erase((list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
            *)p_Var10,(iterator)local_98._M_parent);
  if (p_Var10 != (_Base_ptr)local_98._0_8_) {
    local_a8 = (vector<int,std::allocator<int>> *)&this->SortedTests;
    do {
      local_d8._M_current = (int *)0x0;
      _Stack_d0._M_current = (int *)0x0;
      local_c8 = (_Base_ptr)0x0;
      std::vector<int,std::allocator<int>>::_M_range_insert<std::_Rb_tree_const_iterator<int>>
                ((vector<int,std::allocator<int>> *)&local_d8,0,p_Var10->_M_parent[1]._M_parent,
                 &p_Var10->_M_parent->_M_right);
      _Var17._M_current = _Stack_d0._M_current;
      _Var13._M_current = local_d8._M_current;
      if (local_d8._M_current != _Stack_d0._M_current) {
        lVar12 = (long)_Stack_d0._M_current - (long)local_d8._M_current >> 2;
        local_a0 = p_Var10;
        pVar20 = std::get_temporary_buffer<int>((lVar12 - (lVar12 + 1 >> 0x3f)) + 1 >> 1);
        lVar12 = pVar20.second;
        __buffer = pVar20.first;
        if (__buffer == (int *)0x0) {
          local_68._M_comp.Handler = (TestComparator)(TestComparator)this;
          std::
          __inplace_stable_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<TestComparator>>
                    (_Var13,_Var17,&local_68);
          lVar12 = 0;
        }
        else {
          local_70._M_comp.Handler = (TestComparator)(TestComparator)this;
          std::
          __stable_sort_adaptive<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int*,long,__gnu_cxx::__ops::_Iter_comp_iter<TestComparator>>
                    (_Var13,_Var17,__buffer,lVar12,&local_70);
        }
        operator_delete(__buffer,lVar12 << 2);
        p_Var10 = local_a0;
        this_01 = local_a8;
        p_Var1 = &local_60._M_impl.super__Rb_tree_header;
        _Var13._M_current = _Stack_d0._M_current;
        _Var17._M_current = local_d8._M_current;
        if (local_d8._M_current != _Stack_d0._M_current) {
          do {
            if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_0031e4ec:
              iVar6._M_current =
                   (this->SortedTests).super_vector<int,_std::allocator<int>_>.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_finish;
              if (iVar6._M_current ==
                  (this->SortedTests).super_vector<int,_std::allocator<int>_>.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (this_01,iVar6,_Var17._M_current);
              }
              else {
                *iVar6._M_current = *_Var17._M_current;
                (this->SortedTests).super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish = iVar6._M_current + 1;
              }
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>
                        ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )&local_60,_Var17._M_current);
              _Var13._M_current = _Stack_d0._M_current;
            }
            else {
              iVar2 = *_Var17._M_current;
              p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
              p_Var16 = &p_Var1->_M_header;
              do {
                p_Var15 = p_Var16;
                p_Var14 = p_Var7;
                _Var3 = p_Var14[1]._M_color;
                p_Var16 = p_Var14;
                if ((int)_Var3 < iVar2) {
                  p_Var16 = p_Var15;
                }
                p_Var7 = (&p_Var14->_M_left)[(int)_Var3 < iVar2];
              } while ((&p_Var14->_M_left)[(int)_Var3 < iVar2] != (_Base_ptr)0x0);
              if ((_Rb_tree_header *)p_Var16 == p_Var1) goto LAB_0031e4ec;
              if ((int)_Var3 < iVar2) {
                p_Var14 = p_Var15;
              }
              if (iVar2 < (int)p_Var14[1]._M_color) goto LAB_0031e4ec;
            }
            _Var17._M_current = _Var17._M_current + 1;
          } while (_Var17._M_current != _Var13._M_current);
        }
      }
      if (local_d8._M_current != (int *)0x0) {
        operator_delete(local_d8._M_current,(long)local_c8 - (long)local_d8._M_current);
      }
      p_Var10 = p_Var10->_M_parent;
    } while (p_Var10 != (_Base_ptr)local_98._0_8_);
  }
  std::__cxx11::
  _List_base<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
  ::_M_clear((_List_base<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
              *)&local_98);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  return;
}

Assistant:

void cmCTestMultiProcessHandler::CreateParallelTestCostList()
{
  TestSet alreadySortedTests;

  std::list<TestSet> priorityStack;
  priorityStack.push_back(TestSet());
  TestSet& topLevel = priorityStack.back();

  // In parallel test runs add previously failed tests to the front
  // of the cost list and queue other tests for further sorting
  for (TestMap::const_iterator i = this->Tests.begin(); i != this->Tests.end();
       ++i) {
    if (std::find(this->LastTestsFailed.begin(), this->LastTestsFailed.end(),
                  this->Properties[i->first]->Name) !=
        this->LastTestsFailed.end()) {
      // If the test failed last time, it should be run first.
      this->SortedTests.push_back(i->first);
      alreadySortedTests.insert(i->first);
    } else {
      topLevel.insert(i->first);
    }
  }

  // In parallel test runs repeatedly move dependencies of the tests on
  // the current dependency level to the next level until no
  // further dependencies exist.
  while (!priorityStack.back().empty()) {
    TestSet& previousSet = priorityStack.back();
    priorityStack.push_back(TestSet());
    TestSet& currentSet = priorityStack.back();

    for (TestSet::const_iterator i = previousSet.begin();
         i != previousSet.end(); ++i) {
      TestSet const& dependencies = this->Tests[*i];
      currentSet.insert(dependencies.begin(), dependencies.end());
    }

    for (TestSet::const_iterator i = currentSet.begin(); i != currentSet.end();
         ++i) {
      previousSet.erase(*i);
    }
  }

  // Remove the empty dependency level
  priorityStack.pop_back();

  // Reverse iterate over the different dependency levels (deepest first).
  // Sort tests within each level by COST and append them to the cost list.
  for (std::list<TestSet>::reverse_iterator i = priorityStack.rbegin();
       i != priorityStack.rend(); ++i) {
    TestSet const& currentSet = *i;
    TestComparator comp(this);

    TestList sortedCopy;

    sortedCopy.insert(sortedCopy.end(), currentSet.begin(), currentSet.end());

    std::stable_sort(sortedCopy.begin(), sortedCopy.end(), comp);

    for (TestList::const_iterator j = sortedCopy.begin();
         j != sortedCopy.end(); ++j) {
      if (alreadySortedTests.find(*j) == alreadySortedTests.end()) {
        this->SortedTests.push_back(*j);
        alreadySortedTests.insert(*j);
      }
    }
  }
}